

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__gif_header(stbi__context *s,stbi__gif *g,int *comp,int is_info)

{
  long lVar1;
  stbi_uc sVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  long *in_FS_OFFSET;
  
  sVar2 = stbi__get8(s);
  if (((((sVar2 == 'G') && (sVar2 = stbi__get8(s), sVar2 == 'I')) &&
       (sVar2 = stbi__get8(s), sVar2 == 'F')) && (sVar2 = stbi__get8(s), sVar2 == '8')) &&
     ((sVar2 = stbi__get8(s), sVar2 == '7' || (sVar2 == '9')))) {
    sVar2 = stbi__get8(s);
    lVar1 = *in_FS_OFFSET;
    if (sVar2 == 'a') {
      *(undefined8 *)(lVar1 + -0x20) = "";
      iVar4 = stbi__get16le(s);
      g->w = iVar4;
      iVar4 = stbi__get16le(s);
      g->h = iVar4;
      bVar3 = stbi__get8(s);
      g->flags = (uint)bVar3;
      bVar3 = stbi__get8(s);
      g->bgindex = (uint)bVar3;
      bVar3 = stbi__get8(s);
      g->ratio = (uint)bVar3;
      g->transparent = -1;
      if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        if (is_info != 0) {
          return 1;
        }
        bVar3 = (byte)g->flags;
        if (-1 < (char)bVar3) {
          return 1;
        }
        stbi__gif_parse_colortable(s,g->pal,2 << (bVar3 & 7),-1);
        return 1;
      }
      pcVar5 = "too large";
    }
    else {
      pcVar5 = "not GIF";
    }
    *(undefined8 *)(lVar1 + -0x20) = pcVar5;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0x20) = "not GIF";
  }
  return 0;
}

Assistant:

static int stbi__gif_header(stbi__context *s, stbi__gif *g, int *comp, int is_info)
{
   stbi_uc version;
   if (stbi__get8(s) != 'G' || stbi__get8(s) != 'I' || stbi__get8(s) != 'F' || stbi__get8(s) != '8')
      return stbi__err("not GIF", "Corrupt GIF");

   version = stbi__get8(s);
   if (version != '7' && version != '9')    return stbi__err("not GIF", "Corrupt GIF");
   if (stbi__get8(s) != 'a')                return stbi__err("not GIF", "Corrupt GIF");

   stbi__g_failure_reason = "";
   g->w = stbi__get16le(s);
   g->h = stbi__get16le(s);
   g->flags = stbi__get8(s);
   g->bgindex = stbi__get8(s);
   g->ratio = stbi__get8(s);
   g->transparent = -1;

   if (g->w > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (g->h > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");

   if (comp != 0) *comp = 4;  // can't actually tell whether it's 3 or 4 until we parse the comments

   if (is_info) return 1;

   if (g->flags & 0x80)
      stbi__gif_parse_colortable(s,g->pal, 2 << (g->flags & 7), -1);

   return 1;
}